

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O1

bool __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
::UpdatePointToAttributeIndexMapping
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
           *this,PointAttribute *attribute)

{
  uint uVar1;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar2;
  uint uVar3;
  CornerTable *pCVar4;
  Mesh *pMVar5;
  MeshAttributeIndicesEncodingData *pMVar6;
  pointer paVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  int p;
  long lVar11;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar12;
  bool bVar13;
  
  pCVar4 = (this->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .corner_table_;
  uVar8 = (this->mesh_->super_PointCloud).num_points_;
  attribute->identity_mapping_ = false;
  std::
  vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ::resize(&(attribute->indices_map_).vector_,(ulong)uVar8,
           (value_type *)&kInvalidAttributeValueIndex);
  pMVar5 = this->mesh_;
  paVar7 = (pMVar5->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (int)((ulong)((long)(pMVar5->faces_).vector_.
                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar7) >> 2) *
          -0x55555555;
  bVar13 = uVar8 == 0;
  if (!bVar13) {
    uVar1 = (pMVar5->super_PointCloud).num_points_;
    lVar9 = 0;
    uVar10 = 0;
    do {
      pMVar6 = this->encoding_data_;
      lVar11 = 0;
      do {
        if ((int)(lVar9 + lVar11) == -1) {
          IVar12.value_ = 0xffffffff;
        }
        else {
          IVar12.value_ =
               (pCVar4->corner_to_vertex_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar9 + lVar11 & 0xffffffff].value_;
        }
        if (IVar12.value_ == 0xffffffff) {
          return bVar13;
        }
        IVar2.value_ = paVar7->_M_elems[lVar11].value_;
        if (uVar1 <= IVar2.value_) {
          return bVar13;
        }
        uVar3 = (pMVar6->vertex_to_encoded_attribute_value_index_map).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[IVar12.value_];
        if (uVar1 <= uVar3) {
          return bVar13;
        }
        (attribute->indices_map_).vector_.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[IVar2.value_].value_ = uVar3;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 3;
      paVar7 = paVar7 + 1;
      bVar13 = uVar8 <= uVar10;
    } while (uVar10 != uVar8);
  }
  return bVar13;
}

Assistant:

bool UpdatePointToAttributeIndexMapping(PointAttribute *attribute) override {
    const auto *corner_table = traverser_.corner_table();
    attribute->SetExplicitMapping(mesh_->num_points());
    const size_t num_faces = mesh_->num_faces();
    const size_t num_points = mesh_->num_points();
    for (FaceIndex f(0); f < static_cast<uint32_t>(num_faces); ++f) {
      const auto &face = mesh_->face(f);
      for (int p = 0; p < 3; ++p) {
        const PointIndex point_id = face[p];
        const VertexIndex vert_id =
            corner_table->Vertex(CornerIndex(3 * f.value() + p));
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        const AttributeValueIndex att_entry_id(
            encoding_data_
                ->vertex_to_encoded_attribute_value_index_map[vert_id.value()]);
        if (point_id >= num_points || att_entry_id.value() >= num_points) {
          // There cannot be more attribute values than the number of points.
          return false;
        }
        attribute->SetPointMapEntry(point_id, att_entry_id);
      }
    }
    return true;
  }